

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_align.c
# Opt level: O1

void print_array_int(char *filename,int *array,char *s1,int s1Len,char *s2,int s2Len,
                    parasail_result_t *result)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  __stream = fopen(filename,"w");
  if (__stream != (FILE *)0x0) {
    iVar1 = parasail_result_is_saturated(result);
    fprintf(__stream,"saturated=%d\n",(ulong)(iVar1 != 0));
    fputc(0x20,__stream);
    uVar6 = (ulong)(uint)s2Len;
    if (0 < s2Len) {
      uVar4 = 0;
      do {
        fprintf(__stream,"%4c",(ulong)(uint)(int)s2[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar6 != uVar4);
    }
    fputc(10,__stream);
    if (0 < s1Len) {
      uVar4 = 0;
      do {
        fputc((int)s1[uVar4],__stream);
        if (0 < s2Len) {
          uVar5 = 0;
          do {
            fprintf(__stream,"%4d",(ulong)(uint)array[uVar5]);
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        fputc(10,__stream);
        uVar4 = uVar4 + 1;
        array = array + uVar6;
      } while (uVar4 != (uint)s1Len);
    }
    fclose(__stream);
    return;
  }
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  printf("fopen(\"%s\") error: %s\n",filename,pcVar3);
  exit(-1);
}

Assistant:

static void print_array_int(
        const char * filename,
        int * array,
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        parasail_result_t *result)
{
    int i;
    int j;
    FILE *f = NULL;

    f = fopen(filename, "w");
    if (NULL == f) {
        printf("fopen(\"%s\") error: %s\n", filename, strerror(errno));
        exit(-1);
    }
    fprintf(f, "saturated=%d\n", parasail_result_is_saturated(result) ? 1 : 0);
    fprintf(f, " ");
    for (j=0; j<s2Len; ++j) {
        fprintf(f, "%4c", s2[j]);
    }
    fprintf(f, "\n");
    for (i=0; i<s1Len; ++i) {
        fprintf(f, "%c", s1[i]);
        for (j=0; j<s2Len; ++j) {
            fprintf(f, "%4d", array[i*s2Len + j]);
        }
        fprintf(f, "\n");
    }
    fclose(f);
}